

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_context_get_device_info__null
                    (ma_context *pContext,ma_device_type deviceType,ma_device_id *pDeviceID,
                    ma_share_mode shareMode,ma_device_info *pDeviceInfo)

{
  undefined1 auVar1 [16];
  char cVar2;
  ma_result mVar3;
  long lVar4;
  undefined1 auVar5 [16];
  long lVar6;
  
  if (pContext != (ma_context *)0x0) {
    if ((pDeviceID == (ma_device_id *)0x0) || (mVar3 = -0x68, pDeviceID->wasapi[0] == L'\0')) {
      cVar2 = 'N';
      lVar4 = 0;
      if (deviceType == ma_device_type_playback) {
        do {
          pDeviceInfo->name[lVar4] = cVar2;
          cVar2 = "NULL Playback Device"[lVar4 + 1];
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0x14);
        lVar4 = 0x114;
      }
      else {
        do {
          pDeviceInfo->name[lVar4] = cVar2;
          cVar2 = "NULL Capture Device"[lVar4 + 1];
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0x13);
        lVar4 = 0x113;
      }
      (pDeviceInfo->id).dsound[lVar4] = '\0';
      pDeviceInfo->formatCount = 5;
      auVar1 = _DAT_001155a0;
      lVar4 = 0;
      auVar5 = _DAT_00115590;
      do {
        lVar6 = auVar5._8_8_;
        if (SUB164(auVar5 ^ auVar1,4) == -0x80000000 && SUB164(auVar5 ^ auVar1,0) < -0x7ffffffb) {
          pDeviceInfo->formats[lVar4] = (ma_format)(auVar5._0_8_ + 1);
          pDeviceInfo->formats[lVar4 + 1] = (ma_format)(lVar6 + 1);
        }
        lVar4 = lVar4 + 2;
        auVar5._0_8_ = auVar5._0_8_ + 2;
        auVar5._8_8_ = lVar6 + 2;
      } while (lVar4 != 6);
      pDeviceInfo->minChannels = 1;
      pDeviceInfo->maxChannels = 0x20;
      pDeviceInfo->minSampleRate = 8000;
      pDeviceInfo->maxSampleRate = 0x5dc00;
      mVar3 = 0;
    }
    return mVar3;
  }
  __assert_fail("pContext != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                ,0x24d6,
                "ma_result ma_context_get_device_info__null(ma_context *, ma_device_type, const ma_device_id *, ma_share_mode, ma_device_info *)"
               );
}

Assistant:

static ma_result ma_context_get_device_info__null(ma_context* pContext, ma_device_type deviceType, const ma_device_id* pDeviceID, ma_share_mode shareMode, ma_device_info* pDeviceInfo)
{
    ma_uint32 iFormat;

    MA_ASSERT(pContext != NULL);

    if (pDeviceID != NULL && pDeviceID->nullbackend != 0) {
        return MA_NO_DEVICE;   /* Don't know the device. */
    }

    /* Name / Description */
    if (deviceType == ma_device_type_playback) {
        ma_strncpy_s(pDeviceInfo->name, sizeof(pDeviceInfo->name), "NULL Playback Device", (size_t)-1);
    } else {
        ma_strncpy_s(pDeviceInfo->name, sizeof(pDeviceInfo->name), "NULL Capture Device", (size_t)-1);
    }

    /* Support everything on the null backend. */
    pDeviceInfo->formatCount = ma_format_count - 1;    /* Minus one because we don't want to include ma_format_unknown. */
    for (iFormat = 0; iFormat < pDeviceInfo->formatCount; ++iFormat) {
        pDeviceInfo->formats[iFormat] = (ma_format)(iFormat + 1);  /* +1 to skip over ma_format_unknown. */
    }

    pDeviceInfo->minChannels   = 1;
    pDeviceInfo->maxChannels   = MA_MAX_CHANNELS;
    pDeviceInfo->minSampleRate = MA_SAMPLE_RATE_8000;
    pDeviceInfo->maxSampleRate = MA_SAMPLE_RATE_384000;

    (void)pContext;
    (void)shareMode;
    return MA_SUCCESS;
}